

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# free_list.h
# Opt level: O2

void __thiscall re2c::free_list<const_re2c::Code_*>::clear(free_list<const_re2c::Code_*> *this)

{
  Code *this_00;
  _Base_ptr p_Var1;
  
  this->in_clear = true;
  for (p_Var1 = (this->
                super_set<const_re2c::Code_*,_std::less<const_re2c::Code_*>,_std::allocator<const_re2c::Code_*>_>
                )._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var1 !=
      &(this->
       super_set<const_re2c::Code_*,_std::less<const_re2c::Code_*>,_std::allocator<const_re2c::Code_*>_>
       )._M_t._M_impl.super__Rb_tree_header; p_Var1 = (_Base_ptr)std::_Rb_tree_increment(p_Var1)) {
    this_00 = *(Code **)(p_Var1 + 1);
    if (this_00 != (Code *)0x0) {
      Code::~Code(this_00);
    }
    operator_delete(this_00,0x48);
  }
  std::
  _Rb_tree<const_re2c::Code_*,_const_re2c::Code_*,_std::_Identity<const_re2c::Code_*>,_std::less<const_re2c::Code_*>,_std::allocator<const_re2c::Code_*>_>
  ::clear((_Rb_tree<const_re2c::Code_*,_const_re2c::Code_*,_std::_Identity<const_re2c::Code_*>,_std::less<const_re2c::Code_*>,_std::allocator<const_re2c::Code_*>_>
           *)this);
  this->in_clear = false;
  return;
}

Assistant:

void clear()
	{
		in_clear = true;

		for(iterator it = this->begin(); it != this->end(); ++it)
		{
			delete *it;
		}
		std::set<_Ty>::clear();
		
		in_clear = false;
	}